

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O1

bool __thiscall CDirectiveFunction::Validate(CDirectiveFunction *this,ValidateState *state)

{
  CAssemblerLabel *pCVar1;
  CAssemblerCommand *pCVar2;
  byte bVar3;
  int iVar4;
  int64_t iVar5;
  ValidateState contentValidation;
  undefined1 local_48;
  undefined7 uStack_47;
  char *pcStack_40;
  undefined8 local_38;
  
  iVar5 = FileManager::getVirtualAddress(g_fileManager);
  this->start = iVar5;
  CAssemblerCommand::applyFileInfo
            (&((this->label)._M_t.
               super___uniq_ptr_impl<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>._M_t.
               super__Tuple_impl<0UL,_CAssemblerLabel_*,_std::default_delete<CAssemblerLabel>_>.
               super__Head_base<0UL,_CAssemblerLabel_*,_false>._M_head_impl)->
              super_CAssemblerCommand);
  pCVar1 = (this->label)._M_t.
           super___uniq_ptr_impl<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerLabel_*,_std::default_delete<CAssemblerLabel>_>.
           super__Head_base<0UL,_CAssemblerLabel_*,_false>._M_head_impl;
  bVar3 = (**(code **)((long)(pCVar1->super_CAssemblerCommand)._vptr_CAssemblerCommand + 0x10))
                    (pCVar1,state);
  local_38 = *(undefined8 *)&state->passes;
  _local_48 = CONCAT71((int7)((ulong)*(undefined8 *)state >> 8),1);
  pcStack_40 = "function";
  CAssemblerCommand::applyFileInfo
            ((this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
  pCVar2 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  iVar4 = (*pCVar2->_vptr_CAssemblerCommand[2])(pCVar2,&local_48);
  iVar5 = FileManager::getVirtualAddress(g_fileManager);
  this->end = iVar5;
  return (bool)((byte)iVar4 | bVar3);
}

Assistant:

bool CDirectiveFunction::Validate(const ValidateState &state)
{
	start = g_fileManager->getVirtualAddress();

	label->applyFileInfo();
	bool result = label->Validate(state);

	ValidateState contentValidation = state;
	contentValidation.noFileChange = true;
	contentValidation.noFileChangeDirective = "function";
	content->applyFileInfo();
	if (content->Validate(contentValidation))
		result = true;

	end = g_fileManager->getVirtualAddress();
	return result;
}